

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int streqci(char *s1,char *s2)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  
  lVar2 = 0;
  do {
    cVar3 = s1[lVar2];
    cVar4 = cVar3 + -0x20;
    if (0x19 < (byte)(cVar3 + 0x9fU)) {
      cVar4 = cVar3;
    }
    cVar3 = s2[lVar2];
    cVar1 = cVar3 + -0x20;
    if (0x19 < (byte)(cVar3 + 0x9fU)) {
      cVar1 = cVar3;
    }
    cVar3 = (cVar4 == '\0') * '\x02';
    if (cVar4 != cVar1) {
      cVar3 = '\x01';
    }
    lVar2 = lVar2 + 1;
  } while (cVar3 == '\0');
  return (uint)(cVar3 == '\x02');
}

Assistant:

static int FASTCALL
streqci(const char *s1, const char *s2)
{
  for (;;) {
    char c1 = *s1++;
    char c2 = *s2++;
    if (ASCII_a <= c1 && c1 <= ASCII_z)
      c1 += ASCII_A - ASCII_a;
    if (ASCII_a <= c2 && c2 <= ASCII_z)
      /* The following line will never get executed.  streqci() is
       * only called from two places, both of which guarantee to put
       * upper-case strings into s2.
       */
      c2 += ASCII_A - ASCII_a; /* LCOV_EXCL_LINE */
    if (c1 != c2)
      return 0;
    if (!c1)
      break;
  }
  return 1;
}